

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Float32_To_Int16_DitherClip
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    fVar2 = PaUtil_GenerateFloatTriangularDither(ditherGenerator);
    fVar2 = *sourceBuffer * 32766.0 + fVar2;
    fVar3 = -32768.0;
    if (-32768.0 <= fVar2) {
      fVar3 = fVar2;
    }
    fVar2 = 32767.0;
    if (fVar3 <= 32767.0) {
      fVar2 = fVar3;
    }
    *(short *)destinationBuffer = (short)(int)fVar2;
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 2);
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
  }
  return;
}

Assistant:

static void Float32_To_Int16_DitherClip(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    PaInt16 *dest =  (PaInt16*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {

        float dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        float dithered = (*src * (32766.0f)) + dither;
        PaInt32 samp = (PaInt32) dithered;
        PA_CLIP_( samp, -0x8000, 0x7FFF );
#ifdef PA_USE_C99_LRINTF
        *dest = lrintf(samp-0.5f);
#else
        *dest = (PaInt16) samp;
#endif

        src += sourceStride;
        dest += destinationStride;
    }
}